

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharacterBuffer.h
# Opt level: O1

hash_t __thiscall JsUtil::CharacterBuffer::operator_cast_to_unsigned_int(CharacterBuffer *this)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  ulong uVar5;
  
  if (*(long *)this == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/CharacterBuffer.h"
                       ,0x20,"(string != nullptr)","string != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if ((ulong)*(uint *)(this + 8) == 0) {
    uVar3 = 0x811c9dc5;
  }
  else {
    uVar3 = 0x811c9dc5;
    uVar5 = 0;
    do {
      uVar3 = (*(ushort *)(*(long *)this + uVar5 * 2) ^ uVar3) * 0x1000193;
      uVar5 = uVar5 + 1;
    } while (*(uint *)(this + 8) != uVar5);
  }
  return uVar3;
}

Assistant:

operator hash_t() const
        {
            Assert(string != nullptr);
            return StaticGetHashCode(string, len);
        }